

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar12 = v1->z;
  uVar1 = v1->x;
  uVar3 = v1->y;
  fVar6 = SQRT(fVar12 * fVar12 + (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3);
  uVar5 = -(uint)(fVar6 == 0.0);
  fVar6 = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)(1.0 / fVar6));
  fVar7 = fVar6 * (float)uVar1;
  fVar8 = fVar6 * (float)uVar3;
  v1->x = fVar7;
  v1->y = fVar8;
  fVar6 = fVar6 * fVar12;
  v1->z = fVar6;
  uVar2 = v2->x;
  uVar4 = v2->y;
  fVar11 = fVar8 * v2->z - (float)uVar4 * fVar6;
  fVar9 = (float)uVar2 * fVar6 - v2->z * fVar7;
  fVar10 = (float)uVar4 * fVar7 - (float)uVar2 * fVar8;
  fVar12 = SQRT(fVar10 * fVar10 + fVar11 * fVar11 + fVar9 * fVar9);
  uVar5 = -(uint)(fVar12 == 0.0);
  fVar12 = (float)(uVar5 & 0x3f800000 | ~uVar5 & (uint)(1.0 / fVar12));
  v2->x = fVar6 * fVar12 * fVar9 - fVar8 * fVar12 * fVar10;
  v2->y = fVar7 * fVar12 * fVar10 - fVar6 * fVar12 * fVar11;
  v2->z = fVar12 * fVar11 * fVar8 - fVar12 * fVar9 * fVar7;
  return;
}

Assistant:

RMAPI void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    float length = 0.0f;
    float ilength = 0.0f;

    // Vector3Normalize(*v1);
    Vector3 v = *v1;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    v1->x *= ilength;
    v1->y *= ilength;
    v1->z *= ilength;

    // Vector3CrossProduct(*v1, *v2)
    Vector3 vn1 = { v1->y*v2->z - v1->z*v2->y, v1->z*v2->x - v1->x*v2->z, v1->x*v2->y - v1->y*v2->x };

    // Vector3Normalize(vn1);
    v = vn1;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vn1.x *= ilength;
    vn1.y *= ilength;
    vn1.z *= ilength;

    // Vector3CrossProduct(vn1, *v1)
    Vector3 vn2 = { vn1.y*v1->z - vn1.z*v1->y, vn1.z*v1->x - vn1.x*v1->z, vn1.x*v1->y - vn1.y*v1->x };

    *v2 = vn2;
}